

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_buffer.cpp
# Opt level: O0

void __thiscall cubeb_ring_buffer_Test::TestBody(cubeb_ring_buffer_Test *this)

{
  lock_free_audio_ring_buffer<short> ring_1;
  size_t capacity_frames_1;
  size_t channels_2;
  lock_free_audio_ring_buffer<float> ring;
  size_t capacity_frames;
  size_t channels_1;
  lock_free_audio_ring_buffer<short> q4;
  lock_free_audio_ring_buffer<float> q3;
  size_t channels;
  lock_free_queue<short> q2;
  lock_free_queue<float> q1;
  int capacity_increment;
  int max_capacity;
  int min_capacity;
  int max_channels;
  int min_channels;
  audio_ring_buffer_base<float> *in_stack_00000120;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  audio_ring_buffer_base<float> *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  ring_buffer_base<float> *in_stack_ffffffffffffff20;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_a8;
  undefined8 local_a0;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  lock_free_audio_ring_buffer<short> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  lock_free_audio_ring_buffer<float> *in_stack_ffffffffffffffa0;
  undefined8 local_58;
  
  ring_buffer_base<float>::ring_buffer_base(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  basic_api_test<ring_buffer_base<float>>((ring_buffer_base<float> *)in_stack_00000120);
  ring_buffer_base<short>::ring_buffer_base
            ((ring_buffer_base<short> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  basic_api_test<ring_buffer_base<short>>((ring_buffer_base<short> *)in_stack_00000120);
  for (local_58 = 1; local_58 < 10; local_58 = local_58 + 1) {
    audio_ring_buffer_base<float>::audio_ring_buffer_base
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    basic_api_test<audio_ring_buffer_base<float>>(in_stack_00000120);
    audio_ring_buffer_base<short>::audio_ring_buffer_base
              ((audio_ring_buffer_base<short> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff08);
    basic_api_test<audio_ring_buffer_base<short>>
              ((audio_ring_buffer_base<short> *)in_stack_00000120);
    audio_ring_buffer_base<short>::~audio_ring_buffer_base
              ((audio_ring_buffer_base<short> *)0x132411);
    audio_ring_buffer_base<float>::~audio_ring_buffer_base
              ((audio_ring_buffer_base<float> *)0x13241e);
  }
  for (local_a0 = 1; local_a0 < 10; local_a0 = local_a0 + 1) {
    for (local_a8 = 199; local_a8 < 0x4fd; local_a8 = local_a8 + 0x1b) {
      audio_ring_buffer_base<float>::audio_ring_buffer_base
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
      test_ring<float>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                      );
      audio_ring_buffer_base<float>::~audio_ring_buffer_base
                ((audio_ring_buffer_base<float> *)0x132496);
    }
  }
  for (local_d0 = 1; local_d0 < 10; local_d0 = local_d0 + 1) {
    for (local_d8 = 199; local_d8 < 0x4fd; local_d8 = local_d8 + 0x1b) {
      audio_ring_buffer_base<short>::audio_ring_buffer_base
                ((audio_ring_buffer_base<short> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
      test_ring_multi<short>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      audio_ring_buffer_base<short>::~audio_ring_buffer_base
                ((audio_ring_buffer_base<short> *)0x132511);
    }
  }
  test_reset_api();
  ring_buffer_base<short>::~ring_buffer_base((ring_buffer_base<short> *)0x132545);
  ring_buffer_base<float>::~ring_buffer_base((ring_buffer_base<float> *)0x132552);
  return;
}

Assistant:

TEST(cubeb, ring_buffer)
{
  /* Basic API test. */
  const int min_channels = 1;
  const int max_channels = 10;
  const int min_capacity = 199;
  const int max_capacity = 1277;
  const int capacity_increment = 27;

  lock_free_queue<float> q1(128);
  basic_api_test(q1);
  lock_free_queue<short> q2(128);
  basic_api_test(q2);

  for (size_t channels = min_channels; channels < max_channels; channels++) {
    lock_free_audio_ring_buffer<float> q3(channels, 128);
    basic_api_test(q3);
    lock_free_audio_ring_buffer<short> q4(channels, 128);
    basic_api_test(q4);
  }

  /* Single thread testing. */
  /* Test mono to 9.1 */
  for (size_t channels = min_channels; channels < max_channels; channels++) {
    /* Use non power-of-two numbers to catch edge-cases. */
    for (size_t capacity_frames = min_capacity;
         capacity_frames < max_capacity; capacity_frames+=capacity_increment) {
      lock_free_audio_ring_buffer<float> ring(channels, capacity_frames);
      test_ring(ring, channels, capacity_frames);
    }
  }

  /* Multi thread testing */
  for (size_t channels = min_channels; channels < max_channels; channels++) {
    /* Use non power-of-two numbers to catch edge-cases. */
    for (size_t capacity_frames = min_capacity;
         capacity_frames < max_capacity; capacity_frames+=capacity_increment) {
      lock_free_audio_ring_buffer<short> ring(channels, capacity_frames);
      test_ring_multi(ring, channels, capacity_frames);
    }
  }

  test_reset_api();
}